

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_a1d406::ProcessMetadata
               (uint64_t relDefinesByPropertiesID,ConversionData *conv,Metadata *properties)

{
  DB *this;
  IfcRelDefinesByProperties *properties_00;
  Metadata *conv_00;
  LazyObject *pLVar1;
  IfcPropertySetDefinition *pIVar2;
  uint64_t id;
  allocator<char> local_51;
  string local_50;
  IfcPropertySet *local_30;
  IfcPropertySet *set;
  IfcRelDefinesByProperties *pset;
  Metadata *properties_local;
  ConversionData *conv_local;
  uint64_t relDefinesByPropertiesID_local;
  
  pset = (IfcRelDefinesByProperties *)properties;
  properties_local = (Metadata *)conv;
  conv_local = (ConversionData *)relDefinesByPropertiesID;
  pLVar1 = Assimp::STEP::DB::GetObject(conv->db,relDefinesByPropertiesID);
  set = (IfcPropertySet *)
        Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties>(pLVar1);
  if ((IfcRelDefinesByProperties *)set != (IfcRelDefinesByProperties *)0x0) {
    this = (DB *)(properties_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pIVar2 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>::operator->
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition> *)
                        &(((IfcRelDefinesByProperties *)set)->super_IfcRelDefines).field_0xd0);
    id = Assimp::STEP::Object::GetID
                   ((Object *)
                    ((long)&(pIVar2->super_IfcPropertyDefinition).super_IfcRoot.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                            _vptr_ObjectHelper +
                    (long)(pIVar2->super_IfcPropertyDefinition).super_IfcRoot.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                          _vptr_ObjectHelper[-3]));
    pLVar1 = Assimp::STEP::DB::GetObject(this,id);
    local_30 = Assimp::STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcPropertySet>(pLVar1);
    conv_00 = properties_local;
    properties_00 = pset;
    if (local_30 != (IfcPropertySet *)0x0) {
      pIVar2 = &local_30->super_IfcPropertySetDefinition;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
      ProcessMetadata((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
                      &pIVar2->field_0xb8,(ConversionData *)conv_00,(Metadata *)properties_00,
                      &local_50,0);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
  }
  return;
}

Assistant:

void ProcessMetadata(uint64_t relDefinesByPropertiesID, ConversionData& conv, Metadata& properties)
{
    if (const Schema_2x3::IfcRelDefinesByProperties* const pset = conv.db.GetObject(relDefinesByPropertiesID)->ToPtr<Schema_2x3::IfcRelDefinesByProperties>()) {
        if (const Schema_2x3::IfcPropertySet* const set = conv.db.GetObject(pset->RelatingPropertyDefinition->GetID())->ToPtr<Schema_2x3::IfcPropertySet>()) {
            ProcessMetadata(set->HasProperties, conv, properties);
        }
    }
}